

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# except.cc
# Opt level: O3

void __thiscall
kratos::StmtException::
print_nodes<__gnu_cxx::__normal_iterator<kratos::IRNode*const*,std::vector<kratos::IRNode*,std::allocator<kratos::IRNode*>>>>
          (StmtException *this,
          __normal_iterator<kratos::IRNode_*const_*,_std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>_>
          begin,__normal_iterator<kratos::IRNode_*const_*,_std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>_>
                end)

{
  if (begin._M_current != end._M_current) {
    do {
      print_ast_node(*begin._M_current);
      begin._M_current = begin._M_current + 1;
    } while (begin._M_current != end._M_current);
  }
  return;
}

Assistant:

void StmtException::print_nodes(T begin, T end) noexcept {
    for (auto it = begin; it != end; it++) {
        print_ast_node(*it);
    }
}